

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O3

void __thiscall
Adjacency_Subgraph_update_levels_remove_Test::TestBody
          (Adjacency_Subgraph_update_levels_remove_Test *this)

{
  pointer puVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  size_type sVar6;
  StringLike<const_char_*> *regex;
  pointer *__ptr;
  undefined1 auVar7 [8];
  char *pcVar8;
  char *in_R9;
  internal iVar9;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  DeathTest *gtest_dt;
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  long local_1c0 [2];
  AssertHelper local_1b0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer local_188;
  pointer puStack_180;
  allocator_type local_131;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_120;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_110;
  Adjacency_Subgraph local_100;
  Adjacency_Graph<false> local_98;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_68;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  Disa::create_graph_structured<false>(&local_98,3);
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8,__l,
             (allocator_type *)&local_1e8);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_100,&local_98,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8
             ,2);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
  }
  local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  local_128->_M_use_count = 1;
  local_128->_M_weak_count = 1;
  local_128->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00177c38;
  local_130 = local_128 + 1;
  local_128[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_128[1]._M_use_count = 0;
  local_128[1]._M_weak_count = 0;
  local_128[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_128->_M_use_count = local_128->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_128->_M_use_count = 2;
  }
  local_110.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_130;
  local_110.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_128;
  Disa::Adjacency_Subgraph::update_levels(&local_100,&local_98,1,&local_110);
  if (local_110.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  iVar9 = (internal)
          (local_128[1]._vptr__Sp_counted_base != *(_func_int ***)&local_128[1]._M_use_count);
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1d0._M_head_impl._0_1_ = iVar9;
  if (!(bool)iVar9) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"i_global_local->empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x206,(char *)local_1a8);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,local_1c8);
    }
  }
  sVar5 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)local_1a8,&local_98);
  local_1d0._M_head_impl._0_1_ = (internal)(sVar5 == local_100.hash_parent);
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar5 != local_100.hash_parent) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x207,(char *)local_1a8);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,local_1c8);
    }
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_vertex()","5",(unsigned_long *)&local_1d0,
             (int *)&local_1e8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)((long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) >> 1);
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_edge()","4",(unsigned_long *)&local_1d0,
             (int *)&local_1e8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1e8);
  local_1b0.data_ = (AssertHelperData *)((ulong)local_1b0.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(0)","0",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1e8);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(1)","1",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1e8);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(2)","1",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1e8);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(3)","1",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1e8);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(4)","1",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x210,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long)local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != 8 &&
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      sVar5 = Disa::Adjacency_Subgraph::local_global(&local_100,(size_t *)&local_1d0);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_1a8,"(*i_global_local)[subgraph.local_global(i_vertex)]",
                 "i_vertex",(unsigned_long *)(local_130->_vptr__Sp_counted_base + sVar5),
                 (unsigned_long *)&local_1d0);
      if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
        testing::Message::Message((Message *)&local_1e8);
        pcVar8 = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                   ,0x212,pcVar8);
        testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_1a0._M_pi);
      }
      local_1d0._M_head_impl = local_1d0._M_head_impl + 1;
    } while (((long)local_100.graph.offset.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_100.graph.offset.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) &&
            (local_1d0._M_head_impl <
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((long)local_100.graph.offset.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_100.graph.offset.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) - 1U)));
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[0]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)local_130->_vptr__Sp_counted_base,(unsigned_long *)&local_1d0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x213,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[2]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)(local_130->_vptr__Sp_counted_base + 2),(unsigned_long *)&local_1d0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x214,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[6]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)(local_130->_vptr__Sp_counted_base + 6),(unsigned_long *)&local_1d0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x215,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[8]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)(local_130->_vptr__Sp_counted_base + 8),(unsigned_long *)&local_1d0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x216,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_58.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Disa::Adjacency_Subgraph::update_levels(&local_100,&local_98,0,&local_58);
  if (local_58.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  sVar5 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)local_1a8,&local_98);
  local_1d0._M_head_impl._0_1_ = (internal)(sVar5 == local_100.hash_parent);
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar5 != local_100.hash_parent) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d0,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x219,(char *)local_1a8);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,local_1c8);
    }
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_vertex()","1",(unsigned_long *)&local_1d0,
             (int *)&local_1e8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)((long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) >> 1);
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_edge()","0",(unsigned_long *)&local_1d0,
             (int *)&local_1e8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1e8);
  local_1b0.data_ = local_1b0.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(0)","0",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::local_global(&local_100,(size_t *)&local_1e8);
  local_1b0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.local_global(0)","4",(unsigned_long *)&local_1d0,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1596ac;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1a8,
               (testing *)&local_1d0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_48,(PolymorphicMatcher *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("subgraph.update_levels(Adjacency_Graph<false>(), 1, i_global_local)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                       ,0x221,(DeathTest **)&local_1e8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    auVar7 = (undefined1  [8])
             local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (!bVar2) goto LAB_0011f7ed;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0011f8a5;
    iVar4 = (**(code **)(*local_1e8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x10))
                      (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    puVar1 = local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*local_1e8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 0x18))
                        (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*puVar1 + 0x20))(puVar1,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(size_type *)auVar7 + 8))(auVar7);
        goto LAB_0011f7ed;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_188 = (pointer)0x0;
        puStack_180 = (pointer)0x0;
        local_198._M_allocated_capacity = 0;
        local_198._8_8_ = 0;
        local_1a8 = (undefined1  [8])0x0;
        _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_120.
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_130;
        local_120.
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = local_128;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_128->_M_use_count = local_128->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_128->_M_use_count = local_128->_M_use_count + 1;
        }
        Disa::Adjacency_Subgraph::update_levels
                  (&local_100,(Adjacency_Graph<false> *)local_1a8,1,&local_120);
        if (local_120.
            super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.
                     super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_1a8);
      }
      (**(code **)(*local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x28))
                (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,2);
      (**(code **)(*puVar1 + 0x28))(puVar1,0);
    }
    sVar6 = *(size_type *)auVar7;
  }
  else {
LAB_0011f7ed:
    testing::Message::Message((Message *)local_1a8);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x221,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if (local_1a8 == (undefined1  [8])0x0) goto LAB_0011f8a5;
    sVar6 = *(size_type *)local_1a8;
    auVar7 = local_1a8;
  }
  (**(code **)(sVar6 + 8))(auVar7);
LAB_0011f8a5:
  local_1c0[0] = 0;
  local_1c0[1] = 0;
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1b0.data_ = (AssertHelperData *)&DAT_00000004;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_1b0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1e8,__l_00,&local_131)
    ;
    Disa::Adjacency_Subgraph::Adjacency_Subgraph
              ((Adjacency_Subgraph *)local_1a8,&local_98,&local_1e8,2);
    local_68.
    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.
    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Disa::Adjacency_Subgraph::update_levels((Adjacency_Subgraph *)local_1a8,&local_98,1,&local_68);
    if (local_68.
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.
                 super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_1d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0) {
    operator_delete(local_1d0._M_head_impl,local_1c0[0] + 1);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_100);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_98);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, update_levels_remove) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);
  Adjacency_Subgraph subgraph(graph, {4}, 2);
  std::shared_ptr<std::vector<std::size_t>> i_global_local = std::make_shared<std::vector<std::size_t>>();

  subgraph.update_levels(graph, 1, i_global_local);
  EXPECT_FALSE(i_global_local == nullptr);
  EXPECT_FALSE(i_global_local->empty());
  EXPECT_TRUE(subgraph.is_parent(graph));

  // Check graph details
  EXPECT_EQ(subgraph.size_vertex(), 5);
  EXPECT_EQ(subgraph.size_edge(), 4);
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.vertex_level(1), 1);
  EXPECT_EQ(subgraph.vertex_level(2), 1);
  EXPECT_EQ(subgraph.vertex_level(3), 1);
  EXPECT_EQ(subgraph.vertex_level(4), 1);
  FOR(i_vertex, subgraph.size_vertex())
  EXPECT_EQ((*i_global_local)[subgraph.local_global(i_vertex)], i_vertex);
  EXPECT_EQ((*i_global_local)[0], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[2], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[6], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[8], std::numeric_limits<std::size_t>::max());

  subgraph.update_levels(graph, 0);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 1);
  EXPECT_EQ(subgraph.size_edge(), 0);

  // Check graph details
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.local_global(0), 4);

  EXPECT_DEATH(subgraph.update_levels(Adjacency_Graph<false>(), 1, i_global_local), "./*");
  EXPECT_NO_THROW(Adjacency_Subgraph(graph, {4}, 2).update_levels(graph, 1););  // ensure default does not throw.
}